

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
SetPropertyFromDescriptor<true,int>
          (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<int> *descriptor,Var value,PropertyOperationFlags flags
          ,PropertyValueInfo *info)

{
  Type *pTVar1;
  Type *pTVar2;
  ScriptContext *this_00;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  code *pcVar4;
  uint propertyId_00;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  PropertyRecord **ppPVar11;
  PropertyRecord *pPVar12;
  UndeclaredBlockVariable *pUVar13;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *pSVar14;
  PropertyRecord *pPVar15;
  int local_5c;
  PropertyValueInfo *pPStack_58;
  int propertyIndex;
  Var local_50;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *local_48;
  PropertyOperationFlags local_40;
  uint local_3c;
  SimpleDictionaryPropertyDescriptor<int> *local_38;
  
  pPStack_58 = info;
  local_50 = value;
  local_3c = propertyKey;
  local_38 = descriptor;
  if (instance == (DynamicObject *)0x0) {
    local_40 = flags;
    AssertCount = AssertCount + 1;
    local_48 = (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
               instance;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar5) goto LAB_00e2a186;
    *puVar10 = 0;
    instance = (DynamicObject *)local_48;
    flags = local_40;
  }
  pTVar2 = ((Type *)&(((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                        *)instance)->
                     super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
                     super_DynamicTypeHandler.propertyTypes)->ptr;
  this_00 = (((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar6 = local_38->Attributes;
  if ((bVar6 & 8) == 0) {
    if ((flags & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (bVar6 & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(flags,this_00);
      if (pPStack_58 == (PropertyValueInfo *)0x0) {
        return 0;
      }
      pPStack_58->m_instance = &instance->super_RecyclableObject;
      pPStack_58->m_propertyIndex = 0xffff;
      pPStack_58->m_attributes = '\0';
      pPStack_58->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar14 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                            *)this,instance);
      iVar8 = (*(pSVar14->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                        (pSVar14,instance,(ulong)local_3c,local_50,(ulong)flags,pPStack_58);
      return iVar8;
    }
    if (*(char *)&pTVar2[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar2[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        local_48 = (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
                   this;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar5) goto LAB_00e2a186;
        *puVar10 = 0;
        this = (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)local_48;
      }
      DynamicObject::ChangeType(instance);
    }
    local_40 = flags;
    if ((((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)this)->
          super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).field_0x28
         & 2) != 0) &&
       (bVar5 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                                     *)this,instance,local_38->propertyIndex,&local_5c), bVar5)) {
      ppPVar11 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                               *)this)->
                            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                            ).propertyMap.ptr,local_5c);
      pPVar15 = *ppPVar11;
      pPVar12 = ScriptContext::GetPropertyName(this_00,local_3c);
      if (pPVar15 != pPVar12) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar5) goto LAB_00e2a186;
        *puVar10 = 0;
      }
      local_38 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                                     *)this)->
                                  super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                                  ).propertyMap.ptr,local_5c);
    }
    bVar5 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *)
                       this,this_00);
    if (bVar5) {
      pTVar1 = &(((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
                 this)->
                super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
                numDeletedProperties;
      *pTVar1 = *pTVar1 + 0xff;
    }
    local_38->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    propertyId = local_3c;
    if (local_3c != 0xffffffff) {
      ScriptContext::InvalidateProtoCaches(this_00,local_3c);
    }
    local_38->Attributes = '\a';
    bVar6 = 7;
    flags = local_40;
  }
  if (local_38->propertyIndex == -1) goto LAB_00e2a0fc;
  if (((-1 < (char)flags && 0x3f < bVar6) &&
      (pUVar13 = (UndeclaredBlockVariable *)DynamicObject::GetSlot(instance,local_38->propertyIndex)
      , (flags >> 8 & 1) == 0)) &&
     ((((this_00->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
      pUVar13)) {
    JavascriptError::ThrowReferenceError(this_00,-0x7ff5ec07,(PCWSTR)0x0);
  }
  pRVar3 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)this)->
           super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
           singletonInstance.ptr;
  if (pRVar3 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    bVar5 = false;
  }
  else if ((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
           (pRVar3->super_RecyclerWeakReferenceBase).strongRef ==
           (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)instance)
  {
    bVar5 = true;
  }
  else {
    local_48 = (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
               CONCAT44(local_48._4_4_,propertyId);
    AssertCount = AssertCount + 1;
    local_40 = flags;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x588,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar5) goto LAB_00e2a186;
    *puVar10 = 0;
    bVar5 = false;
    propertyId = (uint)local_48;
    flags = local_40;
  }
  if ((*(byte *)local_38 & 2) == 0) {
    if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)local_38 = *(byte *)local_38 | 2, bVar5)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < local_3c)) {
      local_48 = (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
                 CONCAT44(local_48._4_4_,propertyId);
      if (((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)this)->
           super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
           super_DynamicTypeHandler.flags & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x594,"(!GetIsShared())","!GetIsShared()");
        if (!bVar5) goto LAB_00e2a186;
        *puVar10 = 0;
        propertyId = (uint)local_48;
      }
      if (local_50 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x595,"(value != nullptr)","value != nullptr");
        if (!bVar5) goto LAB_00e2a186;
        *puVar10 = 0;
        propertyId = (uint)local_48;
      }
      BVar9 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar9 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar5) {
LAB_00e2a186:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
        propertyId = (uint)local_48;
      }
      bVar5 = VarIs<Js::JavascriptFunction>(local_50);
      if (bVar5) {
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        bVar6 = *(byte *)local_38;
        if (bVar5) goto LAB_00e2a174;
LAB_00e2a170:
        bVar7 = 4;
      }
      else {
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar5) {
          bVar6 = *(byte *)local_38;
        }
        else {
          bVar5 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,propertyId,local_50)
          ;
          bVar6 = *(byte *)local_38;
          if (bVar5) goto LAB_00e2a170;
        }
LAB_00e2a174:
        bVar7 = 0;
      }
      *(byte *)local_38 = bVar6 & 0xfb | bVar7;
    }
  }
  else {
    pPVar15 = ScriptContext::GetPropertyName(this_00,local_3c);
    InvalidateFixedField<Js::PropertyRecord_const*>
              (this,pPVar15,local_38,
               (((((Type *)&(((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                               *)instance)->
                            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                            ).super_DynamicTypeHandler.propertyTypes)->ptr->javascriptLibrary).ptr)
               ->super_JavascriptLibraryBase).scriptContext.ptr);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,local_38->propertyIndex,local_50);
  if (pPStack_58 != (PropertyValueInfo *)0x0) {
    pPStack_58->m_instance = &instance->super_RecyclableObject;
    pPStack_58->m_propertyIndex = 0xffff;
    pPStack_58->m_attributes = '\0';
    pPStack_58->flags = InlineCacheNoFlags;
  }
LAB_00e2a0fc:
  propertyId_00 = local_3c;
  TPropertyKey_GetUpdateSideEffectPropertyId<int>(propertyId,local_3c);
  if (propertyId_00 != 0xffffffff) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,propertyId_00,local_50,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }